

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O3

void prettyPrintMachine(Machine *m)

{
  size_type *psVar1;
  int iVar2;
  _Rb_tree_color _Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  int local_a8;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  int local_78;
  Machine *local_70;
  _Rb_tree_color local_68;
  pair<const_Hix,_Hcell> it;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"H: ",3);
  iVar2 = (m->h).hix;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0x",2);
  std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|S: ",4);
  iVar2 = (m->s).hix;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0x",2);
  std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Heap:\n",6);
  p_Var4 = (m->heap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(m->heap)._M_t._M_impl.super__Rb_tree_header;
  local_70 = m;
  if ((_Rb_tree_header *)p_Var4 != p_Var5) {
    psVar1 = &it.second.f_.id._M_string_length;
    do {
      local_68 = p_Var4[1]._M_color;
      it._0_8_ = p_Var4[1]._M_parent;
      it.second._0_8_ = psVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&it.second,p_Var4[1]._M_left,
                 (long)&(p_Var4[1]._M_left)->_M_color + (long)&(p_Var4[1]._M_right)->_M_color);
      _Var3 = local_68;
      it.second.f_.id.field_2._8_4_ = *(undefined4 *)&p_Var4[2]._M_left;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0x",2);
      std::ostream::operator<<((ostream *)&std::cout,_Var3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," -> ",4);
      local_d0 = (undefined1  [8])it._0_8_;
      local_c8._M_p = (pointer)&local_b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,it.second._0_8_,
                 it.second.f_.id._M_dataplus._M_p + it.second._0_8_);
      local_a8 = it.second.f_.id.field_2._8_4_;
      Hcell::print((Hcell *)local_d0,(ostream *)&std::cout);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_p != &local_b8) {
        operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      if ((size_type *)it.second._0_8_ != psVar1) {
        operator_delete((void *)it.second._0_8_,it.second.f_.id._M_string_length + 1);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n--\n",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Registers:\n",0xb);
  p_Var4 = (local_70->regval)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(local_70->regval)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var5) {
    psVar1 = &it.second.f_.id._M_string_length;
    do {
      local_68 = p_Var4[1]._M_color;
      it._0_8_ = p_Var4[1]._M_parent;
      it.second._0_8_ = psVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&it.second,p_Var4[1]._M_left,
                 (long)&(p_Var4[1]._M_left)->_M_color + (long)&(p_Var4[1]._M_right)->_M_color);
      _Var3 = local_68;
      it.second.f_.id.field_2._8_4_ = *(undefined4 *)&p_Var4[2]._M_left;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"%",1);
      std::ostream::operator<<((ostream *)&std::cout,_Var3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," -> ",4);
      local_a0 = (undefined1  [8])it._0_8_;
      local_98._M_p = (pointer)&local_88;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,it.second._0_8_,
                 it.second.f_.id._M_dataplus._M_p + it.second._0_8_);
      local_78 = it.second.f_.id.field_2._8_4_;
      Hcell::print((Hcell *)local_a0,(ostream *)&std::cout);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_p != &local_88) {
        operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      if ((size_type *)it.second._0_8_ != psVar1) {
        operator_delete((void *)it.second._0_8_,it.second.f_.id._M_string_length + 1);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n--\n",4);
  return;
}

Assistant:

void prettyPrintMachine(Machine m) {
    // H, S
    std::cout << "H: " << m.h << "|S: " << m.s << "\n";

    std::cout << "Heap:\n";
    for (auto it : m.heap) {
        std::cout << it.first << " -> " << it.second;
        std::cout << "\n";
    }
    std::cout << "\n--\n";

    std::cout << "Registers:\n";
    for (auto it : m.regval) {
        std::cout << it.first << " -> " << it.second;
        std::cout << "\n";
    }
    std::cout << "\n--\n";
}